

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_info.cpp
# Opt level: O1

void __thiscall
DebugUtilsData::LookUpSessionLabels
          (DebugUtilsData *this,XrSession session,
          vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_> *labels)

{
  pointer *ppXVar1;
  ulong uVar2;
  _Hash_node_base *p_Var3;
  _Hash_node_base *p_Var4;
  iterator __position;
  _Hash_node_base *p_Var5;
  _Hash_node_base *p_Var6;
  _Hash_node_base *p_Var7;
  ulong uVar8;
  __node_base_ptr p_Var9;
  __node_base_ptr p_Var10;
  _Hash_node_base *local_38;
  _Hash_node_base *p_Stack_30;
  _Hash_node_base *local_28;
  
  uVar2 = (this->session_labels_)._M_h._M_bucket_count;
  uVar8 = (ulong)session % uVar2;
  p_Var9 = (this->session_labels_)._M_h._M_buckets[uVar8];
  p_Var10 = (__node_base_ptr)0x0;
  if ((p_Var9 != (__node_base_ptr)0x0) &&
     (p_Var7 = p_Var9->_M_nxt, p_Var10 = p_Var9, (XrSession)p_Var9->_M_nxt[1]._M_nxt != session)) {
    while (p_Var9 = p_Var7, p_Var7 = p_Var9->_M_nxt, p_Var7 != (_Hash_node_base *)0x0) {
      p_Var10 = (__node_base_ptr)0x0;
      if (((ulong)p_Var7[1]._M_nxt % uVar2 != uVar8) ||
         (p_Var10 = p_Var9, (XrSession)p_Var7[1]._M_nxt == session)) goto LAB_00108c83;
    }
    p_Var10 = (__node_base_ptr)0x0;
  }
LAB_00108c83:
  if (p_Var10 == (__node_base_ptr)0x0) {
    p_Var7 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var7 = p_Var10->_M_nxt;
  }
  if (p_Var7 != (_Hash_node_base *)0x0) {
    p_Var3 = (p_Var7[2]._M_nxt)->_M_nxt;
    for (p_Var7 = p_Var7[2]._M_nxt[1]._M_nxt; p_Var7 != p_Var3; p_Var7 = p_Var7 + -1) {
      p_Var4 = p_Var7[-1]._M_nxt;
      local_28 = p_Var4[6]._M_nxt;
      local_38 = p_Var4[4]._M_nxt;
      p_Stack_30 = p_Var4[5]._M_nxt;
      __position._M_current =
           (labels->super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>)
           ._M_impl.super__Vector_impl_data._M_finish;
      if (__position._M_current ==
          (labels->super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>).
          _M_impl.super__Vector_impl_data._M_end_of_storage) {
        std::vector<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>::
        _M_realloc_insert<XrDebugUtilsLabelEXT>(labels,__position,(XrDebugUtilsLabelEXT *)&local_38)
        ;
      }
      else {
        p_Var5 = p_Var4[4]._M_nxt;
        p_Var6 = p_Var4[5]._M_nxt;
        (__position._M_current)->labelName = (char *)p_Var4[6]._M_nxt;
        *(_Hash_node_base **)__position._M_current = p_Var5;
        (__position._M_current)->next = p_Var6;
        ppXVar1 = &(labels->
                   super__Vector_base<XrDebugUtilsLabelEXT,_std::allocator<XrDebugUtilsLabelEXT>_>).
                   _M_impl.super__Vector_impl_data._M_finish;
        *ppXVar1 = *ppXVar1 + 1;
      }
    }
  }
  return;
}

Assistant:

void DebugUtilsData::LookUpSessionLabels(XrSession session, std::vector<XrDebugUtilsLabelEXT>& labels) const {
    auto session_label_iterator = session_labels_.find(session);
    if (session_label_iterator != session_labels_.end()) {
        auto& XrSdkSessionLabels = *session_label_iterator->second;
        // Copy the debug utils labels in reverse order in the the labels vector.
        std::transform(XrSdkSessionLabels.rbegin(), XrSdkSessionLabels.rend(), std::back_inserter(labels),
                       [](XrSdkSessionLabelPtr const& label) { return label->debug_utils_label; });
    }
}